

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

Component __thiscall ftxui::Container::Tab(Container *this,Components *children,int *selector)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_31;
  TabContainer *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  int *local_20;
  
  local_30 = (TabContainer *)0x0;
  local_20 = selector;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::TabContainer,std::allocator<ftxui::TabContainer>,std::vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>,int*&>
            (&local_28,&local_30,(allocator<ftxui::TabContainer> *)&local_31,children,&local_20);
  *(TabContainer **)this = local_30;
  *(undefined8 *)(this + 8) = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_28._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Tab(Components children, int* selector) {
  return std::make_shared<TabContainer>(std::move(children), selector);
}